

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::BottomLevelASBase<Diligent::EngineVkImplTraits>::UpdateGeometryIndex
          (BottomLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name,Uint32 *ActualIndex,
          bool OnUpdate)

{
  Uint32 UVar1;
  undefined *puVar2;
  bool bVar3;
  Char *Message;
  pointer ppVar4;
  undefined8 uVar5;
  char *in_R8;
  undefined1 local_a1;
  undefined1 local_a0 [8];
  string _msg;
  HashMapStringKey local_78;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  local_68;
  iterator iter;
  undefined1 local_50 [8];
  string msg;
  bool OnUpdate_local;
  Uint32 *ActualIndex_local;
  char *Name_local;
  BottomLevelASBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xf] = OnUpdate;
  ActualIndex_local = (Uint32 *)Name;
  Name_local = (char *)this;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[32]>((string *)local_50,(char (*) [32])"Geometry name must not be empty");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"UpdateGeometryIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BottomLevelASBase.hpp"
               ,0x79);
    std::__cxx11::string::~string((string *)local_50);
  }
  HashMapStringKey::HashMapStringKey(&local_78,(Char *)ActualIndex_local,false);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
       ::find(&this->m_NameToIndex,&local_78);
  HashMapStringKey::~HashMapStringKey(&local_78);
  _msg.field_2._8_8_ =
       std::
       unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
       ::end(&this->m_NameToIndex);
  bVar3 = std::__detail::operator!=
                    (&local_68,
                     (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                      *)((long)&_msg.field_2 + 8));
  if (bVar3) {
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      UVar1 = *ActualIndex;
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                             *)&local_68);
      (ppVar4->second).ActualIndex = UVar1;
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                             *)&local_68);
      *ActualIndex = (ppVar4->second).ActualIndex;
    }
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                           *)&local_68);
    this_local._4_4_ = (ppVar4->second).IndexInDesc;
  }
  else {
    local_a1 = 0x27;
    FormatString<char[32],char_const*,char>
              ((string *)local_a0,(Diligent *)"Can\'t find geometry with name \'",
               (char (*) [32])&ActualIndex_local,(char **)&local_a1,in_R8);
    puVar2 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      (*(code *)puVar2)(2,uVar5,0);
    }
    std::__cxx11::string::~string((string *)local_a0);
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

Uint32 UpdateGeometryIndex(const char* Name, Uint32& ActualIndex, bool OnUpdate)
    {
        DEV_CHECK_ERR(Name != nullptr && Name[0] != '\0', "Geometry name must not be empty");

        auto iter = m_NameToIndex.find(Name);
        if (iter != m_NameToIndex.end())
        {
            if (OnUpdate)
                ActualIndex = iter->second.ActualIndex;
            else
                iter->second.ActualIndex = ActualIndex;
            return iter->second.IndexInDesc;
        }
        LOG_ERROR_MESSAGE("Can't find geometry with name '", Name, '\'');
        return INVALID_INDEX;
    }